

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::LocalResponse::LocalResponse(LocalResponse *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint firstSegmentWords;
  
  (this->super_ResponseHook)._vptr_ResponseHook = (_func_int **)&PTR__LocalResponse_00662b88;
  firstSegmentWords = 0x400;
  if ((sizeHint->ptr).isSet == true) {
    firstSegmentWords = *(uint *)&(sizeHint->ptr).field_1;
  }
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  return;
}

Assistant:

LocalResponse(kj::Maybe<MessageSize> sizeHint)
      : message(firstSegmentSize(sizeHint)) {}